

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O3

void __thiscall
covenant::Solver<covenant::Sym>::Solver
          (Solver<covenant::Sym> *this,CFGProblem *problem_,reg_solver_t *s,Options opts_)

{
  std::vector<covenant::CFGProblem::Constraint,_std::allocator<covenant::CFGProblem::Constraint>_>::
  vector((vector<covenant::CFGProblem::Constraint,_std::allocator<covenant::CFGProblem::Constraint>_>
          *)this,&problem_->cns);
  boost::unordered::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::unordered_map(&(this->problem).var_table,&problem_->var_table);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&(this->problem).names,&problem_->names);
  this->solver = s;
  (this->exact).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->exact).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->exact).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->cfgs).super__Vector_base<covenant::CFG,_std::allocator<covenant::CFG>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cfgs).super__Vector_base<covenant::CFG,_std::allocator<covenant::CFG>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cfgs).super__Vector_base<covenant::CFG,_std::allocator<covenant::CFG>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->digests).
  super__Vector_base<covenant::CFGDigest<covenant::Sym>,_std::allocator<covenant::CFGDigest<covenant::Sym>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->digests).
  super__Vector_base<covenant::CFGDigest<covenant::Sym>,_std::allocator<covenant::CFGDigest<covenant::Sym>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->digests).
  super__Vector_base<covenant::CFGDigest<covenant::Sym>,_std::allocator<covenant::CFGDigest<covenant::Sym>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->reg_langs).
  super__Vector_base<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->reg_langs).
  super__Vector_base<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->reg_langs).
  super__Vector_base<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->exact).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
  .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->exact).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
  .super__Bit_iterator_base._M_offset = 0;
  (this->opts).max_cegar_iter = opts_.max_cegar_iter;
  (this->opts).gen = opts_.gen;
  (this->opts).abs = opts_.abs;
  (this->opts).is_dot_enabled = opts_.is_dot_enabled;
  *(undefined3 *)&(this->opts).field_0xd = opts_._13_3_;
  (this->opts).shortest_witness = opts_.shortest_witness;
  (this->opts).freq_incr_witness = opts_.freq_incr_witness;
  (this->opts).incr_witness = opts_.incr_witness;
  (this->opts).num_solutions = opts_.num_solutions;
  std::ofstream::ofstream(&this->refine_log);
  std::ofstream::ofstream(&this->abstract_log);
  std::ofstream::ofstream(&this->proof_log);
  this->allCfgsReg = true;
  (this->tfac).px = (element_type *)0x0;
  (this->tfac).pn.pi_ = (sp_counted_base *)0x0;
  this->alphstart = 0;
  this->alphsz = 0;
  this->hasBeenPreprocessed = false;
  if ((this->opts).is_dot_enabled == true) {
    std::ofstream::open((char *)&this->refine_log,0x18a5b3);
    std::ofstream::open((char *)&this->abstract_log,0x18a5c3);
    std::ofstream::open((char *)&this->proof_log,0x18a5d4);
  }
  return;
}

Assistant:

Solver(CFGProblem problem_, reg_solver_t *s, const Options opts_): 
      problem (problem_), solver (s), opts (opts_), 
      allCfgsReg (true), alphstart (0), alphsz (0),
      hasBeenPreprocessed (false)
  {  
    if (opts.is_dot_enabled)
    {
      refine_log.open("refinements.dot");
      abstract_log.open("abstractions.dot");
      proof_log.open("proof.dot");
    }
  }